

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O1

void __thiscall
kj::MainBuilder::MainImpl::operator()
          (MainImpl *this,StringPtr programName,ArrayPtr<const_kj::StringPtr> params)

{
  StringPtr *pSVar1;
  char cVar2;
  char cVar3;
  Impl *pIVar4;
  _Base_ptr p_Var5;
  Arg *pAVar6;
  size_t *psVar7;
  StringPtr programName_00;
  StringPtr programName_01;
  StringPtr programName_02;
  StringPtr programName_03;
  StringPtr programName_04;
  StringPtr programName_05;
  StringPtr programName_06;
  StringPtr programName_07;
  StringPtr programName_08;
  StringPtr programName_09;
  StringPtr programName_10;
  StringPtr programName_11;
  StringPtr programName_12;
  StringPtr programName_13;
  StringPtr programName_14;
  StringPtr programName_15;
  StringPtr programName_16;
  StringPtr programName_17;
  StringPtr programName_18;
  StringPtr programName_19;
  StringPtr programName_20;
  short *__s;
  bool bVar8;
  undefined8 uVar9;
  long *plVar10;
  StringPtr *pSVar11;
  RemoveConst<kj::StringPtr> *pRVar12;
  int iVar13;
  Arg *argSpec;
  iterator iVar14;
  void *pvVar15;
  iterator iVar16;
  Arg *pAVar17;
  Arg *pAVar18;
  _func_int **pp_Var19;
  _Rb_tree_header *p_Var20;
  Arg *params_1;
  undefined8 uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  size_t sVar26;
  char *pcVar27;
  ProcessContext *pPVar28;
  undefined8 uVar29;
  long lVar30;
  size_t __n;
  kj *pkVar31;
  uint uVar32;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  StringPtr message_03;
  StringPtr message_04;
  StringPtr message_05;
  StringPtr message_06;
  StringPtr message_07;
  StringPtr message_08;
  StringPtr message_09;
  StringPtr message_10;
  StringPtr message_11;
  StringPtr message_12;
  StringPtr message_13;
  StringPtr message_14;
  StringPtr message_15;
  StringPtr message_16;
  StringPtr message_17;
  NullableValue<kj::String> _error471;
  StringPtr arg;
  StringPtr param;
  Vector<kj::StringPtr> arguments;
  char c;
  String *in_stack_fffffffffffffea8;
  String *in_stack_fffffffffffffeb0;
  String local_148;
  ArrayDisposer *pAStack_130;
  char *local_128;
  size_t local_120;
  Maybe<kj::String> local_118;
  MainImpl *local_f8;
  NullableValue<kj::String> local_f0;
  int local_d0;
  undefined1 local_c9 [9];
  long *plStack_c0;
  ulong local_b8;
  Arg *local_b0;
  key_type local_a8;
  StringPtr *local_90;
  Vector<kj::StringPtr> local_88;
  ArrayPtr<const_char> local_60;
  Arg *local_50;
  Arg *local_48;
  long local_40;
  char *local_38;
  
  uVar29 = params.size_;
  local_120 = programName.content.size_;
  local_128 = programName.content.ptr;
  local_88.builder.ptr = (StringPtr *)0x0;
  local_88.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
  local_88.builder.endPtr = (StringPtr *)0x0;
  local_88.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_f8 = this;
  if ((Arg *)uVar29 != (Arg *)0x0) {
    local_50 = (Arg *)(local_120 - 1);
    local_48 = (Arg *)(params.ptr + uVar29);
    uVar23 = 0;
    pAVar18 = local_48;
    local_b0 = (Arg *)uVar29;
    local_90 = params.ptr;
    do {
      uVar29 = pAVar18;
      pSVar11 = local_90;
      pSVar1 = local_90 + uVar23;
      local_a8.content.ptr._0_4_ = *(undefined4 *)&(pSVar1->content).ptr;
      local_a8.content.ptr._4_4_ = *(undefined4 *)((long)&(pSVar1->content).ptr + 4);
      psVar7 = &(pSVar1->content).size_;
      local_a8.content.size_._0_4_ = (undefined4)*psVar7;
      local_a8.content.size_._4_4_ = *(undefined4 *)((long)&(pSVar1->content).size_ + 4);
      sVar26 = *psVar7;
      if ((sVar26 == 3) && (iVar13 = bcmp((pSVar1->content).ptr,"--",3), iVar13 == 0)) {
        pAVar18 = (Arg *)(pSVar11 + uVar23 + 1);
        __n = (long)local_48 - (long)pAVar18;
        uVar22 = ((long)__n >> 4) + ((long)local_88.builder.pos - (long)local_88.builder.ptr >> 4);
        if ((ulong)((long)local_88.builder.endPtr - (long)local_88.builder.ptr >> 4) < uVar22) {
          uVar25 = (long)local_88.builder.endPtr - (long)local_88.builder.ptr >> 3;
          if (local_88.builder.endPtr == local_88.builder.ptr) {
            uVar25 = 4;
          }
          if (uVar25 < uVar22) {
            uVar25 = uVar22;
          }
          Vector<kj::StringPtr>::setCapacity(&local_88,uVar25);
        }
        pRVar12 = local_88.builder.pos;
        if (local_48 != pAVar18) {
          memcpy(local_88.builder.pos,pAVar18,__n);
        }
        local_88.builder.pos = (RemoveConst<kj::StringPtr> *)((long)pRVar12 + __n);
        local_d0 = 2;
LAB_001c7e7c:
        bVar8 = false;
        uVar22 = local_b8;
      }
      else {
        __s = (short *)CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_);
        uVar22 = sVar26 - 1;
        if ((uVar22 < 2) || (*__s != 0x2d2d)) {
          if (((uVar22 == 0) || (uVar22 == 1)) || ((char)*__s != '-')) {
            pIVar4 = (this->impl).ptr;
            if ((pIVar4->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
              iVar14 = ::std::
                       _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                       ::find(&(pIVar4->subCommands)._M_t,&local_a8);
              pIVar4 = (this->impl).ptr;
              p_Var20 = &(pIVar4->subCommands)._M_t._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)iVar14._M_node == p_Var20) {
                if ((CONCAT44(local_a8.content.size_._4_4_,(undefined4)local_a8.content.size_) != 5)
                   || (iVar13 = bcmp((void *)CONCAT44(local_a8.content.ptr._4_4_,
                                                      local_a8.content.ptr._0_4_),"help",5),
                      iVar13 != 0)) {
                  str<kj::StringPtr&,char_const(&)[18]>
                            (&local_148,(kj *)&local_a8,(StringPtr *)": unknown command",
                             (char (*) [18])p_Var20);
                  pcVar27 = local_148.content.ptr;
                  if ((Arg *)local_148.content.size_ == (Arg *)0x0) {
                    pcVar27 = "";
                  }
                  message_08.content.size_ =
                       (char *)((long)&((ArrayPtr<const_char> *)local_148.content.size_)->ptr +
                               (ulong)((Arg *)local_148.content.size_ == (Arg *)0x0));
                  programName_11.content.size_ = local_120;
                  programName_11.content.ptr = local_128;
                  message_08.content.ptr = pcVar27;
                  usageError(local_f8,programName_11,message_08);
                }
                if (local_b0 <= uVar23 + 1) {
                  programName_07.content.size_ = local_120;
                  programName_07.content.ptr = local_128;
                  printHelp(this,programName_07);
                }
                pkVar31 = (kj *)(pSVar11 + uVar23 + 1);
                iVar14 = ::std::
                         _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                         ::find(&(pIVar4->subCommands)._M_t,(key_type *)pkVar31);
                pIVar4 = (this->impl).ptr;
                p_Var20 = &(pIVar4->subCommands)._M_t._M_impl.super__Rb_tree_header;
                if ((_Rb_tree_header *)iVar14._M_node == p_Var20) {
                  if ((*(long *)(pkVar31 + 8) != 5) ||
                     (iVar13 = bcmp(*(void **)pkVar31,"help",5), iVar13 != 0)) {
                    str<kj::StringPtr_const&,char_const(&)[18]>
                              (&local_148,pkVar31,(StringPtr *)": unknown command",
                               (char (*) [18])p_Var20);
                    pcVar27 = local_148.content.ptr;
                    if ((Arg *)local_148.content.size_ == (Arg *)0x0) {
                      pcVar27 = "";
                    }
                    message_10.content.size_ =
                         (char *)((long)&((ArrayPtr<const_char> *)local_148.content.size_)->ptr +
                                 (ulong)((Arg *)local_148.content.size_ == (Arg *)0x0));
                    programName_13.content.size_ = local_120;
                    programName_13.content.ptr = local_128;
                    message_10.content.ptr = pcVar27;
                    usageError(local_f8,programName_13,message_10);
                  }
                  pAVar18 = (Arg *)(ulong)((int)uVar23 + 2);
                  uVar32 = 0;
                  if (local_b0 <= pAVar18) goto LAB_001c8854;
                  uVar32 = 0;
                  goto LAB_001c87f3;
                }
                (*(code *)**(undefined8 **)iVar14._M_node[1]._M_right)(local_c9 + 1);
                local_60.ptr = "--help";
                local_60.size_ = 7;
                local_118.ptr._0_8_ = local_128;
                local_118.ptr.field_1.value.content.ptr = (char *)local_50;
                local_c9[0] = 0x20;
                local_f0._0_8_ = *(undefined8 *)pkVar31;
                local_f0.field_1.value.content.ptr = (char *)(*(long *)(pkVar31 + 8) + -1);
                _::
                concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                          (&local_148,(_ *)&local_118,(ArrayPtr<const_char> *)local_c9,
                           (FixedArray<char,_1UL> *)&local_f0,(ArrayPtr<const_char> *)uVar29);
                pcVar27 = "";
                if ((Arg *)local_148.content.size_ != (Arg *)0x0) {
                  pcVar27 = local_148.content.ptr;
                }
                uVar29 = (Arg *)0x1;
                (**(code **)*plStack_c0)
                          (plStack_c0,pcVar27,
                           (char *)((long)&((ArrayPtr<const_char> *)local_148.content.size_)->ptr +
                                   (ulong)((Arg *)local_148.content.size_ == (Arg *)0x0)));
                pAVar18 = (Arg *)local_148.content.size_;
                pcVar27 = local_148.content.ptr;
                if (local_148.content.ptr != (char *)0x0) {
                  local_148.content.ptr = (char *)0x0;
                  local_148.content.size_ = 0;
                  (**(local_148.content.disposer)->_vptr_ArrayDisposer)
                            (local_148.content.disposer,pcVar27,1);
                  uVar29 = pAVar18;
                }
                plVar10 = plStack_c0;
                if (plStack_c0 != (long *)0x0) {
                  plStack_c0 = (long *)0x0;
                  (*(code *)**(undefined8 **)local_c9._1_8_)
                            (local_c9._1_8_,(long)plVar10 + *(long *)(*plVar10 + -0x10));
                }
              }
              else {
                (*(code *)**(undefined8 **)iVar14._M_node[1]._M_right)(local_c9 + 1);
                local_118.ptr._0_8_ = local_128;
                local_118.ptr.field_1.value.content.ptr = (char *)local_50;
                local_60.ptr = (char *)CONCAT71(local_60.ptr._1_7_,0x20);
                local_f0._4_4_ = local_a8.content.ptr._4_4_;
                local_f0._0_4_ = local_a8.content.ptr._0_4_;
                local_f0.field_1.value.content.ptr =
                     (char *)(CONCAT44(local_a8.content.size_._4_4_,
                                       (undefined4)local_a8.content.size_) + -1);
                _::
                concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                          (&local_148,(_ *)&local_118,&local_60,(FixedArray<char,_1UL> *)&local_f0,
                           (ArrayPtr<const_char> *)uVar29);
                pcVar27 = "";
                if ((Arg *)local_148.content.size_ != (Arg *)0x0) {
                  pcVar27 = local_148.content.ptr;
                }
                uVar29 = (long)local_b0 - (uVar23 + 1);
                (**(code **)*plStack_c0)
                          (plStack_c0,pcVar27,
                           (char *)((long)&((ArrayPtr<const_char> *)local_148.content.size_)->ptr +
                                   (ulong)((Arg *)local_148.content.size_ == (Arg *)0x0)));
                pAVar18 = (Arg *)local_148.content.size_;
                pcVar27 = local_148.content.ptr;
                if (local_148.content.ptr != (char *)0x0) {
                  local_148.content.ptr = (char *)0x0;
                  local_148.content.size_ = 0;
                  (**(local_148.content.disposer)->_vptr_ArrayDisposer)
                            (local_148.content.disposer,pcVar27,1);
                  uVar29 = pAVar18;
                }
                plVar10 = plStack_c0;
                if (plStack_c0 != (long *)0x0) {
                  plStack_c0 = (long *)0x0;
                  (*(code *)**(undefined8 **)local_c9._1_8_)
                            (local_c9._1_8_,(long)plVar10 + *(long *)(*plVar10 + -0x10));
                }
              }
              local_d0 = 1;
              goto LAB_001c7e7c;
            }
            if (local_88.builder.pos == local_88.builder.endPtr) {
              sVar26 = (long)local_88.builder.endPtr - (long)local_88.builder.ptr >> 3;
              if (local_88.builder.endPtr == local_88.builder.ptr) {
                sVar26 = 4;
              }
              Vector<kj::StringPtr>::setCapacity(&local_88,sVar26);
            }
            *(undefined4 *)local_88.builder.pos = local_a8.content.ptr._0_4_;
            *(undefined4 *)((long)local_88.builder.pos + 4) = local_a8.content.ptr._4_4_;
            *(undefined4 *)((long)local_88.builder.pos + 8) = (undefined4)local_a8.content.size_;
            *(undefined4 *)((long)local_88.builder.pos + 0xc) = local_a8.content.size_._4_4_;
            local_88.builder.pos = (RemoveConst<kj::StringPtr> *)((long)local_88.builder.pos + 0x10)
            ;
            local_d0 = 0;
            bVar8 = true;
            uVar22 = local_b8;
          }
          else {
            lVar30 = CONCAT44(local_a8.content.size_._4_4_,(undefined4)local_a8.content.size_);
            uVar25 = lVar30 - 1;
            local_d0 = 0;
            bVar8 = true;
            uVar22 = local_b8;
            if (1 < uVar25) {
              uVar24 = 1;
              do {
                cVar2 = *(char *)(CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_) +
                                 uVar24);
                local_60.ptr = (char *)CONCAT71(local_60.ptr._1_7_,cVar2);
                pIVar4 = (this->impl).ptr;
                p_Var20 = &(pIVar4->shortOptions)._M_t._M_impl.super__Rb_tree_header;
                uVar29 = p_Var20;
                for (pAVar18 = (Arg *)(pIVar4->shortOptions)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent; pAVar18 != (Arg *)0x0;
                    pAVar18 = (Arg *)(&(pAVar18->callback).impl.disposer)[cVar3 < cVar2]) {
                  cVar3 = (char)pAVar18->minCount;
                  if (cVar2 <= cVar3) {
                    uVar29 = pAVar18;
                  }
                }
                pAVar18 = (Arg *)p_Var20;
                if (((_Rb_tree_header *)uVar29 != p_Var20) &&
                   (pAVar18 = (Arg *)uVar29, cVar2 < (char)((Arg *)uVar29)->minCount)) {
                  uVar29 = p_Var20;
                  pAVar18 = (Arg *)p_Var20;
                }
                if (pAVar18 == (Arg *)p_Var20) {
                  str<char_const(&)[2],char&,char_const(&)[22]>
                            (&local_148,(kj *)0x1f71f3,(char (*) [2])&local_60,
                             ": unrecognized option",(char (*) [22])uVar29);
                  pcVar27 = local_148.content.ptr;
                  if ((Arg *)local_148.content.size_ == (Arg *)0x0) {
                    pcVar27 = "";
                  }
                  message_02.content.size_ =
                       (char *)((long)&((ArrayPtr<const_char> *)local_148.content.size_)->ptr +
                               (ulong)((Arg *)local_148.content.size_ == (Arg *)0x0));
                  programName_03.content.size_ = local_120;
                  programName_03.content.ptr = local_128;
                  message_02.content.ptr = pcVar27;
                  usageError(local_f8,programName_03,message_02);
                }
                p_Var5 = (_Base_ptr)pAVar18[1].title.content.ptr;
                cVar2 = *(char *)&p_Var5->_M_left;
                if (cVar2 == '\x01') {
                  uVar22 = (ulong)((int)uVar24 + 1);
                  if (uVar22 < uVar25) {
                    local_c9._1_8_ =
                         CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_) + uVar22;
                    plStack_c0 = (long *)(lVar30 - uVar22);
                    (*(code *)**(undefined8 **)p_Var5->_M_right->_M_parent)(&local_f0);
                    Maybe<kj::String>::Maybe(&local_118,(Maybe<kj::String> *)&local_f0);
                    uVar21 = local_f0.field_1.value.content.size_;
                    uVar9 = local_f0.field_1.value.content.ptr;
                    local_148.content.ptr =
                         (char *)CONCAT71(local_148.content.ptr._1_7_,local_118.ptr.isSet);
                    if ((_)local_118.ptr.isSet == (_)0x1) {
                      local_148.content.size_ = (size_t)local_118.ptr.field_1.value.content.ptr;
                      local_148.content.disposer =
                           (ArrayDisposer *)local_118.ptr.field_1.value.content.size_;
                      pAStack_130 = local_118.ptr.field_1.value.content.disposer;
                      local_118.ptr.field_1.value.content.ptr = (char *)0x0;
                      local_118.ptr.field_1.value.content.size_ = 0;
                    }
                    if ((local_f0.isSet == true) &&
                       (local_f0.field_1.value.content.ptr != (char *)0x0)) {
                      local_f0.field_1.value.content.ptr = (char *)0x0;
                      local_f0.field_1.value.content.size_ = 0;
                      (**(local_f0.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                                (local_f0.field_1.value.content.disposer,uVar9,1);
                      uVar29 = uVar21;
                    }
                    if ((char)local_148.content.ptr == '\x01') {
                      str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr&,char_const(&)[3],kj::String&>
                                ((String *)&local_118,(kj *)0x1f71f3,(char (*) [2])&local_60," ",
                                 (char (*) [2])(local_c9 + 1),(StringPtr *)0x1ea1ca,
                                 (char (*) [3])&local_148.content.size_,in_stack_fffffffffffffeb0);
                      pcVar27 = (char *)local_118.ptr._0_8_;
                      if ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0) {
                        pcVar27 = "";
                      }
                      message_06.content.size_ =
                           local_118.ptr.field_1.value.content.ptr +
                           ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0);
                      programName_09.content.size_ = local_120;
                      programName_09.content.ptr = local_128;
                      message_06.content.ptr = pcVar27;
                      usageError(local_f8,programName_09,message_06);
                    }
                  }
                  else {
                    uVar23 = uVar23 + 1;
                    if (local_b0 <= uVar23) {
LAB_001c85b6:
                      str<char_const(&)[2],char&,char_const(&)[19]>
                                (&local_148,(kj *)0x1f71f3,(char (*) [2])&local_60,
                                 ": missing argument",(char (*) [19])uVar29);
                      pcVar27 = local_148.content.ptr;
                      if ((Arg *)local_148.content.size_ == (Arg *)0x0) {
                        pcVar27 = "";
                      }
                      message_04.content.size_ =
                           (char *)((long)&((ArrayPtr<const_char> *)local_148.content.size_)->ptr +
                                   (ulong)((Arg *)local_148.content.size_ == (Arg *)0x0));
                      programName_05.content.size_ = local_120;
                      programName_05.content.ptr = local_128;
                      message_04.content.ptr = pcVar27;
                      usageError(local_f8,programName_05,message_04);
                    }
                    sVar26 = local_90[uVar23].content.size_;
                    if (((sVar26 != 1) && (sVar26 != 2)) && (*local_90[uVar23].content.ptr == '-'))
                    goto LAB_001c85b6;
                    (*(code *)**(undefined8 **)p_Var5->_M_right->_M_parent)(&local_f0);
                    Maybe<kj::String>::Maybe(&local_118,(Maybe<kj::String> *)&local_f0);
                    uVar21 = local_f0.field_1.value.content.size_;
                    uVar9 = local_f0.field_1.value.content.ptr;
                    local_148.content.ptr =
                         (char *)CONCAT71(local_148.content.ptr._1_7_,local_118.ptr.isSet);
                    if ((_)local_118.ptr.isSet == (_)0x1) {
                      local_148.content.size_ = (size_t)local_118.ptr.field_1.value.content.ptr;
                      local_148.content.disposer =
                           (ArrayDisposer *)local_118.ptr.field_1.value.content.size_;
                      pAStack_130 = local_118.ptr.field_1.value.content.disposer;
                      local_118.ptr.field_1.value.content.ptr = (char *)0x0;
                      local_118.ptr.field_1.value.content.size_ = 0;
                    }
                    if ((local_f0.isSet == true) &&
                       (local_f0.field_1.value.content.ptr != (char *)0x0)) {
                      local_f0.field_1.value.content.ptr = (char *)0x0;
                      local_f0.field_1.value.content.size_ = 0;
                      (**(local_f0.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                                (local_f0.field_1.value.content.disposer,uVar9,1);
                      uVar29 = uVar21;
                    }
                    this = local_f8;
                    if ((char)local_148.content.ptr == '\x01') {
                      str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                                ((String *)&local_118,(kj *)0x1f71f3,(char (*) [2])&local_60," ",
                                 (char (*) [2])(local_90 + uVar23),(StringPtr *)0x1ea1ca,
                                 (char (*) [3])&local_148.content.size_,in_stack_fffffffffffffeb0);
                      pcVar27 = (char *)local_118.ptr._0_8_;
                      if ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0) {
                        pcVar27 = "";
                      }
                      message_05.content.size_ =
                           local_118.ptr.field_1.value.content.ptr +
                           ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0);
                      programName_08.content.size_ = local_120;
                      programName_08.content.ptr = local_128;
                      message_05.content.ptr = pcVar27;
                      usageError(local_f8,programName_08,message_05);
                    }
                  }
                }
                else {
                  (*(code *)**(undefined8 **)p_Var5->_M_right->_M_parent)(&local_f0);
                  Maybe<kj::String>::Maybe(&local_118,(Maybe<kj::String> *)&local_f0);
                  uVar21 = local_f0.field_1.value.content.size_;
                  uVar9 = local_f0.field_1.value.content.ptr;
                  local_148.content.ptr =
                       (char *)CONCAT71(local_148.content.ptr._1_7_,local_118.ptr.isSet);
                  if ((_)local_118.ptr.isSet == (_)0x1) {
                    local_148.content.size_ = (size_t)local_118.ptr.field_1.value.content.ptr;
                    local_148.content.disposer =
                         (ArrayDisposer *)local_118.ptr.field_1.value.content.size_;
                    pAStack_130 = local_118.ptr.field_1.value.content.disposer;
                    local_118.ptr.field_1.value.content.ptr = (char *)0x0;
                    local_118.ptr.field_1.value.content.size_ = 0;
                  }
                  if ((local_f0.isSet == true) &&
                     (local_f0.field_1.value.content.ptr != (char *)0x0)) {
                    local_f0.field_1.value.content.ptr = (char *)0x0;
                    local_f0.field_1.value.content.size_ = 0;
                    pAVar18 = (Arg *)0x0;
                    (**(local_f0.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                              (local_f0.field_1.value.content.disposer,uVar9,1);
                    uVar29 = uVar21;
                  }
                  if ((char)local_148.content.ptr == '\x01') {
                    str<char_const(&)[2],char&,char_const(&)[3],kj::String&>
                              ((String *)&local_118,(kj *)0x1f71f3,(char (*) [2])&local_60,": ",
                               (char (*) [3])&local_148.content.size_,(String *)pAVar18);
                    pcVar27 = (char *)local_118.ptr._0_8_;
                    if ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0) {
                      pcVar27 = "";
                    }
                    message_03.content.size_ =
                         local_118.ptr.field_1.value.content.ptr +
                         ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0);
                    programName_04.content.size_ = local_120;
                    programName_04.content.ptr = local_128;
                    message_03.content.ptr = pcVar27;
                    usageError(local_f8,programName_04,message_03);
                  }
                }
                uVar22 = local_b8;
                if (cVar2 != '\0') break;
                uVar24 = (ulong)((int)uVar24 + 1);
                lVar30 = CONCAT44(local_a8.content.size_._4_4_,(undefined4)local_a8.content.size_);
                uVar25 = lVar30 - 1;
              } while (uVar24 < uVar25);
            }
          }
        }
        else {
          local_c9._1_8_ = 0;
          plStack_c0 = (long *)0x0;
          pvVar15 = memchr(__s,0x3d,uVar22);
          uVar22 = (long)pvVar15 - (long)__s;
          local_c9._1_8_ = __s + 1;
          if (pvVar15 == (void *)0x0) {
            plStack_c0 = (long *)(sVar26 - 3);
            uVar22 = local_b8;
          }
          else {
            plStack_c0 = (long *)(uVar22 - 2);
            local_38 = (char *)((long)__s + uVar22 + 1);
            local_40 = sVar26 - (uVar22 + 1);
          }
          iVar16 = ::std::
                   _Rb_tree<kj::ArrayPtr<const_char>,_std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>,_std::_Select1st<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>,_std::less<kj::ArrayPtr<const_char>_>,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
                   ::find(&(((this->impl).ptr)->longOptions)._M_t,(key_type *)(local_c9 + 1));
          if ((_Rb_tree_header *)iVar16._M_node ==
              &(((this->impl).ptr)->longOptions)._M_t._M_impl.super__Rb_tree_header) {
            if ((CONCAT44(local_a8.content.size_._4_4_,(undefined4)local_a8.content.size_) == 7) &&
               (iVar13 = bcmp((void *)CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_
                                              ),"--help",7), iVar13 == 0)) {
              programName_06.content.size_ = local_120;
              programName_06.content.ptr = local_128;
              printHelp(local_f8,programName_06);
            }
            str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[22]>
                      (&local_148,(kj *)"--",(char (*) [3])(local_c9 + 1),
                       (ArrayPtr<const_char> *)": unrecognized option",(char (*) [22])uVar29);
            pcVar27 = local_148.content.ptr;
            if ((Arg *)local_148.content.size_ == (Arg *)0x0) {
              pcVar27 = "";
            }
            message_09.content.size_ =
                 (char *)((long)&((ArrayPtr<const_char> *)local_148.content.size_)->ptr +
                         (ulong)((Arg *)local_148.content.size_ == (Arg *)0x0));
            programName_12.content.size_ = local_120;
            programName_12.content.ptr = local_128;
            message_09.content.ptr = pcVar27;
            usageError(local_f8,programName_12,message_09);
          }
          p_Var5 = iVar16._M_node[1]._M_left;
          if (*(char *)&p_Var5->_M_left == '\x01') {
            if (pvVar15 == (void *)0x0) {
              uVar23 = uVar23 + 1;
              if (local_b0 <= uVar23) {
LAB_001c8a0d:
                str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[19]>
                          (&local_148,(kj *)"--",(char (*) [3])(local_c9 + 1),
                           (ArrayPtr<const_char> *)": missing argument",(char (*) [19])uVar29);
                pcVar27 = local_148.content.ptr;
                if ((Arg *)local_148.content.size_ == (Arg *)0x0) {
                  pcVar27 = "";
                }
                message_16.content.size_ =
                     (char *)((long)&((ArrayPtr<const_char> *)local_148.content.size_)->ptr +
                             (ulong)((Arg *)local_148.content.size_ == (Arg *)0x0));
                programName_19.content.size_ = local_120;
                programName_19.content.ptr = local_128;
                message_16.content.ptr = pcVar27;
                usageError(local_f8,programName_19,message_16);
              }
              sVar26 = local_90[uVar23].content.size_;
              if (((sVar26 != 1) && (sVar26 != 2)) && (*local_90[uVar23].content.ptr == '-'))
              goto LAB_001c8a0d;
              (*(code *)**(undefined8 **)p_Var5->_M_right->_M_parent)(&local_f0);
              Maybe<kj::String>::Maybe(&local_118,(Maybe<kj::String> *)&local_f0);
              uVar21 = local_f0.field_1.value.content.size_;
              uVar9 = local_f0.field_1.value.content.ptr;
              local_148.content.ptr =
                   (char *)CONCAT71(local_148.content.ptr._1_7_,local_118.ptr.isSet);
              if ((_)local_118.ptr.isSet == (_)0x1) {
                local_148.content.size_ = (size_t)local_118.ptr.field_1.value.content.ptr;
                local_148.content.disposer =
                     (ArrayDisposer *)local_118.ptr.field_1.value.content.size_;
                pAStack_130 = local_118.ptr.field_1.value.content.disposer;
                local_118.ptr.field_1.value.content.ptr = (char *)0x0;
                local_118.ptr.field_1.value.content.size_ = 0;
              }
              if ((local_f0.isSet == true) && (local_f0.field_1.value.content.ptr != (char *)0x0)) {
                local_f0.field_1.value.content.ptr = (char *)0x0;
                local_f0.field_1.value.content.size_ = 0;
                (**(local_f0.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                          (local_f0.field_1.value.content.disposer,uVar9,1);
                uVar29 = uVar21;
              }
              if ((char)local_148.content.ptr == '\x01') {
                str<kj::StringPtr&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                          ((String *)&local_118,(kj *)&local_a8,(StringPtr *)"=",
                           (char (*) [2])(local_90 + uVar23),(StringPtr *)0x1ea1ca,
                           (char (*) [3])&local_148.content.size_,in_stack_fffffffffffffea8);
                pcVar27 = (char *)local_118.ptr._0_8_;
                if ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0) {
                  pcVar27 = "";
                }
                message_17.content.size_ =
                     local_118.ptr.field_1.value.content.ptr +
                     ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0);
                programName_20.content.size_ = local_120;
                programName_20.content.ptr = local_128;
                message_17.content.ptr = pcVar27;
                usageError(local_f8,programName_20,message_17);
              }
            }
            else {
              p_Var5 = p_Var5->_M_right->_M_parent;
              (*(code *)**(undefined8 **)p_Var5)(&local_f0,p_Var5,local_38);
              Maybe<kj::String>::Maybe(&local_118,(Maybe<kj::String> *)&local_f0);
              uVar21 = local_f0.field_1.value.content.size_;
              uVar9 = local_f0.field_1.value.content.ptr;
              local_148.content.ptr =
                   (char *)CONCAT71(local_148.content.ptr._1_7_,local_118.ptr.isSet);
              if ((_)local_118.ptr.isSet == (_)0x1) {
                local_148.content.size_ = (size_t)local_118.ptr.field_1.value.content.ptr;
                local_148.content.disposer =
                     (ArrayDisposer *)local_118.ptr.field_1.value.content.size_;
                pAStack_130 = local_118.ptr.field_1.value.content.disposer;
                local_118.ptr.field_1.value.content.ptr = (char *)0x0;
                local_118.ptr.field_1.value.content.size_ = 0;
              }
              if ((local_f0.isSet == true) && (local_f0.field_1.value.content.ptr != (char *)0x0)) {
                local_f0.field_1.value.content.ptr = (char *)0x0;
                local_f0.field_1.value.content.size_ = 0;
                (**(local_f0.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                          (local_f0.field_1.value.content.disposer,uVar9,1);
                uVar29 = uVar21;
              }
              if ((char)local_148.content.ptr == '\x01') {
                str<kj::StringPtr&,char_const(&)[3],kj::String&>
                          ((String *)&local_118,(kj *)&local_a8,(StringPtr *)0x1ea1ca,
                           (char (*) [3])&local_148.content.size_,(String *)uVar29);
                pcVar27 = (char *)local_118.ptr._0_8_;
                if ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0) {
                  pcVar27 = "";
                }
                message_15.content.size_ =
                     local_118.ptr.field_1.value.content.ptr +
                     ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0);
                programName_18.content.size_ = local_120;
                programName_18.content.ptr = local_128;
                message_15.content.ptr = pcVar27;
                usageError(local_f8,programName_18,message_15);
              }
            }
          }
          else {
            if (pvVar15 != (void *)0x0) {
              str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[37]>
                        (&local_148,(kj *)"--",(char (*) [3])(local_c9 + 1),
                         (ArrayPtr<const_char> *)": option does not accept an argument",
                         (char (*) [37])uVar29);
              pcVar27 = local_148.content.ptr;
              if ((Arg *)local_148.content.size_ == (Arg *)0x0) {
                pcVar27 = "";
              }
              message_11.content.size_ =
                   (char *)((long)&((ArrayPtr<const_char> *)local_148.content.size_)->ptr +
                           (ulong)((Arg *)local_148.content.size_ == (Arg *)0x0));
              programName_14.content.size_ = local_120;
              programName_14.content.ptr = local_128;
              message_11.content.ptr = pcVar27;
              usageError(local_f8,programName_14,message_11);
            }
            (*(code *)**(undefined8 **)p_Var5->_M_right->_M_parent)(&local_f0);
            Maybe<kj::String>::Maybe(&local_118,(Maybe<kj::String> *)&local_f0);
            uVar21 = local_f0.field_1.value.content.size_;
            uVar9 = local_f0.field_1.value.content.ptr;
            local_148.content.ptr =
                 (char *)CONCAT71(local_148.content.ptr._1_7_,local_118.ptr.isSet);
            if ((_)local_118.ptr.isSet == (_)0x1) {
              local_148.content.size_ = (size_t)local_118.ptr.field_1.value.content.ptr;
              local_148.content.disposer =
                   (ArrayDisposer *)local_118.ptr.field_1.value.content.size_;
              pAStack_130 = local_118.ptr.field_1.value.content.disposer;
              local_118.ptr.field_1.value.content.ptr = (char *)0x0;
              local_118.ptr.field_1.value.content.size_ = 0;
            }
            if ((local_f0.isSet == true) && (local_f0.field_1.value.content.ptr != (char *)0x0)) {
              local_f0.field_1.value.content.ptr = (char *)0x0;
              local_f0.field_1.value.content.size_ = 0;
              (**(local_f0.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                        (local_f0.field_1.value.content.disposer,uVar9,1,uVar21,uVar21,0);
              uVar29 = uVar21;
            }
            if ((char)local_148.content.ptr == '\x01') {
              str<kj::StringPtr&,char_const(&)[3],kj::String&>
                        ((String *)&local_118,(kj *)&local_a8,(StringPtr *)0x1ea1ca,
                         (char (*) [3])&local_148.content.size_,(String *)uVar29);
              pcVar27 = (char *)local_118.ptr._0_8_;
              if ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0) {
                pcVar27 = "";
              }
              message_12.content.size_ =
                   local_118.ptr.field_1.value.content.ptr +
                   ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0);
              programName_15.content.size_ = local_120;
              programName_15.content.ptr = local_128;
              message_12.content.ptr = pcVar27;
              usageError(local_f8,programName_15,message_12);
            }
          }
          local_d0 = 0;
          bVar8 = true;
        }
      }
      if (!bVar8) goto LAB_001c8136;
      uVar23 = uVar23 + 1;
      pAVar18 = (Arg *)uVar29;
      local_b8 = uVar22;
    } while (uVar23 < local_b0);
    local_d0 = 2;
LAB_001c8136:
    if (local_d0 != 2) goto LAB_001c83fa;
  }
  pIVar4 = (this->impl).ptr;
  if ((pIVar4->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    programName_10.content.size_ = local_120;
    programName_10.content.ptr = local_128;
    message_07.content.size_ = 0x10;
    message_07.content.ptr = "missing command";
    usageError(this,programName_10,message_07);
  }
  pAVar6 = (pIVar4->args).builder.pos;
  params_1 = (Arg *)0x0;
  pAVar18 = (pIVar4->args).builder.ptr;
  for (pAVar17 = pAVar18; pAVar17 != pAVar6; pAVar17 = pAVar17 + 1) {
    params_1 = (Arg *)(ulong)((int)params_1 + pAVar17->minCount);
  }
  pkVar31 = (kj *)local_88.builder.ptr;
  if (pAVar18 != pAVar6) {
    local_b8 = CONCAT44(local_b8._4_4_,(int)params_1);
    local_b0 = pAVar6;
    do {
      if (pAVar18->minCount == 0) {
        uVar32 = 0;
      }
      else {
        uVar32 = 0;
        do {
          if (pkVar31 == (kj *)local_88.builder.pos) {
            str<char_const(&)[18],kj::StringPtr&>
                      (&local_148,(kj *)"missing argument ",(char (*) [18])pAVar18,&params_1->title)
            ;
            pcVar27 = local_148.content.ptr;
            if ((Arg *)local_148.content.size_ == (Arg *)0x0) {
              pcVar27 = "";
            }
            message_00.content.size_ =
                 (char *)((long)&((ArrayPtr<const_char> *)local_148.content.size_)->ptr +
                         (ulong)((Arg *)local_148.content.size_ == (Arg *)0x0));
            programName_01.content.size_ = local_120;
            programName_01.content.ptr = local_128;
            message_00.content.ptr = pcVar27;
            usageError(this,programName_01,message_00);
          }
          params_1 = *(Arg **)(pkVar31 + 8);
          p_Var5 = (_Base_ptr)(pAVar18->callback).impl.ptr;
          (*(code *)**(undefined8 **)p_Var5)(&local_f0,p_Var5,*(undefined8 *)pkVar31);
          Maybe<kj::String>::Maybe(&local_118,(Maybe<kj::String> *)&local_f0);
          uVar21 = local_f0.field_1.value.content.size_;
          uVar9 = local_f0.field_1.value.content.ptr;
          local_148.content.ptr = (char *)CONCAT71(local_148.content.ptr._1_7_,local_118.ptr.isSet);
          if ((_)local_118.ptr.isSet == (_)0x1) {
            local_148.content.size_ = (size_t)local_118.ptr.field_1.value.content.ptr;
            local_148.content.disposer = (ArrayDisposer *)local_118.ptr.field_1.value.content.size_;
            pAStack_130 = local_118.ptr.field_1.value.content.disposer;
            local_118.ptr.field_1.value.content.ptr = (char *)0x0;
            local_118.ptr.field_1.value.content.size_ = 0;
          }
          if ((local_f0.isSet == true) && (local_f0.field_1.value.content.ptr != (char *)0x0)) {
            local_f0.field_1.value.content.ptr = (char *)0x0;
            local_f0.field_1.value.content.size_ = 0;
            uVar29 = uVar21;
            (**(local_f0.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                      (local_f0.field_1.value.content.disposer,uVar9,1,uVar21,uVar21,0);
            params_1 = (Arg *)uVar21;
          }
          if ((char)local_148.content.ptr == '\x01') {
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      ((String *)&local_118,pkVar31,(StringPtr *)0x1ea1ca,
                       (char (*) [3])&local_148.content.size_,(String *)uVar29);
            pcVar27 = (char *)local_118.ptr._0_8_;
            if ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0) {
              pcVar27 = "";
            }
            message.content.size_ =
                 local_118.ptr.field_1.value.content.ptr +
                 ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0);
            programName_00.content.size_ = local_120;
            programName_00.content.ptr = local_128;
            message.content.ptr = pcVar27;
            usageError(this,programName_00,message);
          }
          pkVar31 = pkVar31 + 0x10;
          uVar32 = uVar32 + 1;
        } while (uVar32 < pAVar18->minCount);
        local_b8 = CONCAT44(local_b8._4_4_,(int)local_b8 - uVar32);
      }
      if (uVar32 < pAVar18->maxCount) {
        uVar23 = local_b8 & 0xffffffff;
        lVar30 = -(long)pkVar31;
        do {
          if ((long)((long)local_88.builder.pos + lVar30) >> 4 <= (long)uVar23) break;
          params_1 = *(Arg **)(pkVar31 + 8);
          p_Var5 = (_Base_ptr)(pAVar18->callback).impl.ptr;
          (*(code *)**(undefined8 **)p_Var5)(&local_f0,p_Var5,*(undefined8 *)pkVar31);
          Maybe<kj::String>::Maybe(&local_118,(Maybe<kj::String> *)&local_f0);
          uVar21 = local_f0.field_1.value.content.size_;
          uVar9 = local_f0.field_1.value.content.ptr;
          local_148.content.ptr = (char *)CONCAT71(local_148.content.ptr._1_7_,local_118.ptr.isSet);
          if ((_)local_118.ptr.isSet == (_)0x1) {
            local_148.content.size_ = (size_t)local_118.ptr.field_1.value.content.ptr;
            local_148.content.disposer = (ArrayDisposer *)local_118.ptr.field_1.value.content.size_;
            pAStack_130 = local_118.ptr.field_1.value.content.disposer;
            local_118.ptr.field_1.value.content.ptr = (char *)0x0;
            local_118.ptr.field_1.value.content.size_ = 0;
          }
          if ((local_f0.isSet == true) && (local_f0.field_1.value.content.ptr != (char *)0x0)) {
            local_f0.field_1.value.content.ptr = (char *)0x0;
            local_f0.field_1.value.content.size_ = 0;
            uVar29 = uVar21;
            (**(local_f0.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                      (local_f0.field_1.value.content.disposer,uVar9,1);
            params_1 = (Arg *)uVar21;
          }
          if ((char)local_148.content.ptr == '\x01') {
            str<kj::StringPtr&,char_const(&)[3],kj::String&>
                      ((String *)&local_118,pkVar31,(StringPtr *)0x1ea1ca,
                       (char (*) [3])&local_148.content.size_,(String *)uVar29);
            pcVar27 = (char *)local_118.ptr._0_8_;
            if ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0) {
              pcVar27 = "";
            }
            message_01.content.size_ =
                 local_118.ptr.field_1.value.content.ptr +
                 ((Arg *)local_118.ptr.field_1.value.content.ptr == (Arg *)0x0);
            programName_02.content.size_ = local_120;
            programName_02.content.ptr = local_128;
            message_01.content.ptr = pcVar27;
            usageError(local_f8,programName_02,message_01);
          }
          pkVar31 = pkVar31 + 0x10;
          uVar32 = uVar32 + 1;
          lVar30 = lVar30 + -0x10;
        } while (uVar32 < pAVar18->maxCount);
      }
      pAVar18 = pAVar18 + 1;
      this = local_f8;
    } while (pAVar18 != local_b0);
  }
  if (pkVar31 < local_88.builder.pos) {
    str<kj::StringPtr&,char_const(&)[21]>
              (&local_148,pkVar31,(StringPtr *)": too many arguments",(char (*) [21])params_1);
    pcVar27 = local_148.content.ptr;
    if ((Arg *)local_148.content.size_ == (Arg *)0x0) {
      pcVar27 = "";
    }
    message_13.content.size_ =
         (char *)((long)&((ArrayPtr<const_char> *)local_148.content.size_)->ptr +
                 (ulong)((Arg *)local_148.content.size_ == (Arg *)0x0));
    programName_16.content.size_ = local_120;
    programName_16.content.ptr = local_128;
    message_13.content.ptr = pcVar27;
    usageError(local_f8,programName_16,message_13);
  }
  pIVar4 = (this->impl).ptr;
  if ((pIVar4->finalCallback).ptr.isSet == true) {
    (**((pIVar4->finalCallback).ptr.field_1.value.impl.ptr)->_vptr_Iface)(&local_f0);
    Maybe<kj::String>::Maybe(&local_118,(Maybe<kj::String> *)&local_f0);
    uVar9 = local_f0.field_1.value.content.size_;
    uVar29 = local_f0.field_1.value.content.ptr;
    local_148.content.ptr = (char *)CONCAT71(local_148.content.ptr._1_7_,local_118.ptr.isSet);
    if ((_)local_118.ptr.isSet == (_)0x1) {
      local_148.content.size_ = (size_t)local_118.ptr.field_1.value.content.ptr;
      local_148.content.disposer = (ArrayDisposer *)local_118.ptr.field_1.value.content.size_;
      pAStack_130 = local_118.ptr.field_1.value.content.disposer;
      local_118.ptr.field_1.value.content.ptr = (char *)0x0;
      local_118.ptr.field_1.value.content.size_ = 0;
    }
    if ((local_f0.isSet == true) && (local_f0.field_1.value.content.ptr != (char *)0x0)) {
      local_f0.field_1.value.content.ptr = (char *)0x0;
      local_f0.field_1.value.content.size_ = 0;
      (**(local_f0.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                (local_f0.field_1.value.content.disposer,uVar29,1,uVar9,uVar9,0);
    }
    if ((char)local_148.content.ptr == '\x01') {
      pAVar18 = (Arg *)local_148.content.size_;
      if (local_148.content.disposer == (ArrayDisposer *)0x0) {
        pAVar18 = (Arg *)0x1f73e6;
      }
      message_14.content.size_ =
           (long)&(local_148.content.disposer)->_vptr_ArrayDisposer +
           (ulong)(local_148.content.disposer == (ArrayDisposer *)0x0);
      programName_17.content.size_ = local_120;
      programName_17.content.ptr = local_128;
      message_14.content.ptr = (char *)pAVar18;
      usageError(local_f8,programName_17,message_14);
    }
  }
LAB_001c83fa:
  pSVar11 = local_88.builder.endPtr;
  pRVar12 = local_88.builder.pos;
  pSVar1 = local_88.builder.ptr;
  if ((kj *)local_88.builder.ptr != (kj *)0x0) {
    local_88.builder.ptr = (StringPtr *)0x0;
    local_88.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
    local_88.builder.endPtr = (StringPtr *)0x0;
    (**(local_88.builder.disposer)->_vptr_ArrayDisposer)
              (local_88.builder.disposer,pSVar1,0x10,(long)pRVar12 - (long)pSVar1 >> 4,
               (long)pSVar11 - (long)pSVar1 >> 4,0);
  }
  return;
  while( true ) {
    if (iVar13 != 0) break;
    pAVar18 = (Arg *)(ulong)((int)uVar23 + 3 + uVar32);
    uVar32 = uVar32 + 1;
    if (local_b0 <= pAVar18) break;
LAB_001c87f3:
    sVar26 = local_90[(long)pAVar18].content.size_;
    if (sVar26 == 7) {
      iVar13 = bcmp(local_90[(long)pAVar18].content.ptr,"--help",7);
    }
    else {
      if (sVar26 != 5) break;
      iVar13 = bcmp(local_90[(long)pAVar18].content.ptr,"help",5);
    }
  }
LAB_001c8854:
  if (uVar32 == 0) {
    pPVar28 = pIVar4->context;
    pp_Var19 = pPVar28->_vptr_ProcessContext + 5;
    uVar29 = 0x27;
    pcVar27 = "Help about help?  We must go deeper...";
  }
  else if (uVar32 == 1) {
    pPVar28 = pIVar4->context;
    pp_Var19 = pPVar28->_vptr_ProcessContext + 5;
    uVar29 = 0x6d;
    pcVar27 = 
    "Yo dawg, I heard you like help.  So I wrote you some help about how to use help so you can get help on help."
    ;
  }
  else if (uVar32 == 2) {
    pPVar28 = pIVar4->context;
    pp_Var19 = pPVar28->_vptr_ProcessContext + 5;
    uVar29 = 0x2a;
    pcVar27 = "Help, I\'m trapped in a help text factory!";
  }
  else {
    pPVar28 = pIVar4->context;
    if (uVar32 < 10) {
      pp_Var19 = pPVar28->_vptr_ProcessContext + 4;
      uVar29 = 0x1f;
      pcVar27 = "Killed by signal 911 (SIGHELP)";
    }
    else {
      pp_Var19 = pPVar28->_vptr_ProcessContext + 5;
      uVar29 = 0x1d;
      pcVar27 = "How to keep an idiot busy...";
    }
  }
  iVar13 = (**pp_Var19)(pPVar28,pcVar27,uVar29);
  __clang_call_terminate(iVar13);
}

Assistant:

void MainBuilder::MainImpl::operator()(StringPtr programName, ArrayPtr<const StringPtr> params) {
  Vector<StringPtr> arguments;

  for (size_t i = 0; i < params.size(); i++) {
    StringPtr param = params[i];
    if (param == "--") {
      // "--" ends option parsing.
      arguments.addAll(params.begin() + i + 1, params.end());
      break;
    } else if (param.startsWith("--")) {
      // Long option.
      ArrayPtr<const char> name;
      Maybe<StringPtr> maybeArg;
      KJ_IF_SOME(pos, param.findFirst('=')) {
        name = param.slice(2, pos);
        maybeArg = param.slice(pos + 1);
      } else {
        name = param.slice(2);
      }
      auto iter = impl->longOptions.find(name);
      if (iter == impl->longOptions.end()) {
        if (param == "--help") {
          printHelp(programName);
        } else {
          usageError(programName, str("--", name, ": unrecognized option"));
        }
      } else {
        const Impl::Option& option = *iter->second;
        if (option.hasArg) {
          // Argument expected.
          KJ_IF_SOME(arg, maybeArg) {
            // "--foo=blah": "blah" is the argument.
            KJ_IF_SOME(error, (*option.funcWithArg)(arg).releaseError()) {
              usageError(programName, str(param, ": ", error));
            }
          } else if (i + 1 < params.size() &&
                     !(params[i + 1].startsWith("-") && params[i + 1].size() > 1)) {
            // "--foo blah": "blah" is the argument.
            ++i;
            KJ_IF_SOME(error, (*option.funcWithArg)(params[i]).releaseError()) {
              usageError(programName, str(param, "=", params[i], ": ", error));
            }
          } else {
            usageError(programName, str("--", name, ": missing argument"));
          }
        } else {
          // No argument expected.
          if (maybeArg == kj::none) {
            KJ_IF_SOME(error, (*option.func)().releaseError()) {
              usageError(programName, str(param, ": ", error));
            }
          } else {
            usageError(programName, str("--", name, ": option does not accept an argument"));
          }
        }
      }
    }